

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O1

void __thiscall Centaurus::ATNNode<wchar_t>::parse(ATNNode<wchar_t> *this,Stream *stream)

{
  wchar_t *pwVar1;
  int iVar2;
  ATNNodeType AVar3;
  wchar_t wVar4;
  uint uVar5;
  StreamException *__return_storage_ptr__;
  uint uVar6;
  
  pwVar1 = (stream->m_cur)._M_current;
  if (pwVar1 == (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
    wVar4 = L'\0';
  }
  else {
    wVar4 = *pwVar1;
  }
  if ((wVar4 == L'_') || (iVar2 = iswalpha(wVar4), iVar2 != 0)) {
    Identifier::parse(&this->m_invoke,stream);
    AVar3 = Nonterminal;
  }
  else if ((wVar4 == L'\"') || (wVar4 == L'\'')) {
    parse_literal(this,stream);
    AVar3 = LiteralTerminal;
  }
  else {
    if (wVar4 != L'/') {
      __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(__return_storage_ptr__,stream,wVar4);
      goto LAB_001582b0;
    }
    Stream::get(stream);
    NFA<wchar_t>::parse(&this->m_nfa,stream);
    AVar3 = RegularTerminal;
  }
  this->m_type = AVar3;
  wVar4 = Stream::skip_whitespace(stream);
  if (wVar4 != L'{') {
    return;
  }
  Stream::get(stream);
  wVar4 = Stream::skip_whitespace(stream);
  if (wVar4 == L'}') {
    __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(__return_storage_ptr__,stream,L'}');
  }
  else {
    iVar2 = 0;
    if ((uint)(wVar4 + L'\xffffffd0') < 10) {
      iVar2 = 0;
      uVar6 = wVar4 + L'\xffffffd0';
      do {
        Stream::get(stream);
        pwVar1 = (stream->m_cur)._M_current;
        if (pwVar1 == (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
          uVar5 = 0xffffffd0;
        }
        else {
          uVar5 = *pwVar1 + L'\xffffffd0';
        }
        iVar2 = uVar6 + iVar2 * 10;
        uVar6 = uVar5;
      } while (uVar5 < 10);
    }
    wVar4 = Stream::skip_whitespace(stream);
    if (wVar4 == L'}') {
      Stream::get(stream);
      Stream::skip_whitespace(stream);
      this->m_localid = iVar2;
      return;
    }
    __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(__return_storage_ptr__,stream,wVar4);
  }
LAB_001582b0:
  __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,StreamException::~StreamException);
}

Assistant:

void ATNNode<TCHAR>::parse(Stream& stream)
{
    wchar_t ch = stream.peek();

    if (Identifier::is_symbol_leader(ch))
    {
        m_invoke.parse(stream);
        m_type = ATNNodeType::Nonterminal;
    }
    else if (ch == L'/')
    {
        stream.discard();
        m_nfa.parse(stream);
        m_type = ATNNodeType::RegularTerminal;
    }
    else if (ch == L'\'' || ch == L'"')
    {
        parse_literal(stream);
        m_type = ATNNodeType::LiteralTerminal;
    }
    else
    {
        throw stream.unexpected(ch);
    }

    ch = stream.skip_whitespace();

    if (ch == L'{')
    {
		stream.discard();

        ch = stream.skip_whitespace();

        if (ch == L'}')
            throw stream.unexpected(ch);

        int id = 0;
        for (; L'0' <= ch && ch <= L'9'; ch = stream.peek())
        {
            id = id * 10 + static_cast<int>(ch - L'0');
            stream.discard();
        }
        
        ch = stream.skip_whitespace();
        if (ch != L'}')
            throw stream.unexpected(ch);
        stream.discard();

		stream.skip_whitespace();

        m_localid = id;
    }
}